

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O2

int AF_A_SpawnFizzle(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *this_00;
  char *__assertion;
  int iVar6;
  double dVar7;
  double dVar8;
  FName local_54;
  DAngle local_50;
  DVector3 pos;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053c740;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053c57a:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053c740;
        }
      }
      if (numparam == 1) goto LAB_0053c5fa;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0053c730;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053c740;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053c730;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053c5fa:
        dVar1 = this_00->Speed;
        local_50.Degrees = (this_00->Angles).Yaw.Degrees;
        AActor::Vec3Angle(&pos,this_00,5.0,&local_50,this_00->Height * 0.5 - this_00->Floorclip,
                          false);
        iVar6 = 5;
        while (bVar3 = iVar6 != 0, iVar6 = iVar6 + -1, bVar3) {
          FName::FName(&local_54,"SorcSpark1");
          pAVar5 = Spawn(&local_54,&pos,ALLOW_REPLACE);
          if (pAVar5 != (AActor *)0x0) {
            iVar4 = FRandom::operator()(&pr_heresiarch);
            dVar7 = (double)(iVar4 % 5) * 11.377777777777778 + (this_00->Angles).Yaw.Degrees;
            iVar4 = FRandom::operator()(&pr_heresiarch);
            dVar8 = fastcosdeg(dVar7);
            (pAVar5->Vel).X = dVar8 * (double)(iVar4 % (int)dVar1);
            iVar4 = FRandom::operator()(&pr_heresiarch);
            dVar7 = fastsindeg(dVar7);
            (pAVar5->Vel).Y = dVar7 * (double)(iVar4 % (int)dVar1);
            (pAVar5->Vel).Z = 2.0;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053c740;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053c57a;
  }
LAB_0053c730:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053c740:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x2b3,"int AF_A_SpawnFizzle(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnFizzle)
{
	PARAM_ACTION_PROLOGUE;
	int speed = (int)self->Speed;
	DAngle rangle;
	AActor *mo;
	int ix;

	DVector3 pos = self->Vec3Angle(5., self->Angles.Yaw, -self->Floorclip + self->Height / 2. );
	for (ix=0; ix<5; ix++)
	{
		mo = Spawn("SorcSpark1", pos, ALLOW_REPLACE);
		if (mo)
		{
			rangle = self->Angles.Yaw + (pr_heresiarch() % 5) * (4096 / 360.);
			mo->Vel.X = (pr_heresiarch() % speed) * rangle.Cos();
			mo->Vel.Y = (pr_heresiarch() % speed) * rangle.Sin();
			mo->Vel.Z = 2;
		}
	}
	return 0;
}